

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

test_suite * init_unit_test_suite(int argc,char **argv)

{
  test_suite *ptVar1;
  size_t sVar2;
  DataFileTest *pDVar3;
  test_case *ptVar4;
  master_test_suite_t *pmVar5;
  shared_ptr<DataFileTest> t1;
  shared_ptr<DataFileTest> local_3a0;
  shared_ptr<DataFileTest> local_390;
  shared_ptr<DataFileTest> local_380;
  shared_ptr<DataFileTest> local_370;
  shared_ptr<DataFileTest> local_360;
  shared_ptr<DataFileTest> local_350;
  shared_ptr<DataFileTest> local_340;
  shared_ptr<DataFileTest> local_330;
  shared_ptr<DataFileTest> local_320;
  shared_ptr<DataFileTest> local_310;
  shared_ptr<DataFileTest> local_300;
  shared_ptr<DataFileTest> local_2f0;
  shared_ptr<DataFileTest> local_2e0;
  const_string local_2d0;
  const_string local_2c0;
  const_string local_2b0;
  const_string local_2a0;
  const_string local_290;
  const_string local_280;
  const_string local_270;
  const_string local_260;
  const_string local_250;
  const_string local_240;
  const_string local_230;
  const_string local_220;
  const_string local_210;
  const_string local_200;
  const_string local_1f0;
  const_string local_1e0;
  const_string local_1d0;
  const_string local_1c0;
  const_string local_1b0;
  const_string local_1a0;
  const_string local_190;
  const_string local_180;
  const_string local_170;
  const_string local_160;
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  ptVar1 = (test_suite *)operator_new(0x180);
  local_40.m_begin = "DataFile tests: test1.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test1.df");
  local_40.m_end = "DataFile tests: test1.df" + sVar2;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_50.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_40,&local_50,0x1d5);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test1.df",
             "{\"type\": \"record\",\"name\":\"ComplexInteger\", \"fields\": [{\"name\":\"re\", \"type\":\"long\"},{\"name\":\"im\", \"type\":\"long\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexInteger\", \"fields\": [{\"name\":\"re\", \"type\":\"long\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_140.m_begin = "&DataFileTest::testWrite";
  local_140.m_end = "";
  local_150.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_150.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_2e0.px = t1.px;
  local_2e0.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testWrite,0,&local_140,&local_150,0x1d7,&local_2e0)
  ;
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_2e0.pn);
  addReaderTests(ptVar1,&t1);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_60.m_begin = "DataFile tests: test2.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test2.df");
  local_60.m_end = "DataFile tests: test2.df" + sVar2;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_70.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_60,&local_70,0x1dc);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test2.df",
             "{\"type\": \"record\",\"name\":\"ComplexInteger\", \"fields\": [{\"name\":\"re\", \"type\":\"long\"},{\"name\":\"im\", \"type\":\"long\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexInteger\", \"fields\": [{\"name\":\"re\", \"type\":\"long\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_160.m_begin = "&DataFileTest::testWriteGeneric";
  local_160.m_end = "";
  local_170.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_170.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_2f0.px = t1.px;
  local_2f0.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testWriteGeneric,0,&local_160,&local_170,0x1de,
                      &local_2f0);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_2f0.pn);
  addReaderTests(ptVar1,&t1);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_80.m_begin = "DataFile tests: test3.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test3.df");
  local_80.m_end = "DataFile tests: test3.df" + sVar2;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_90.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_80,&local_90,0x1e3);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test3.df",
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"},{\"name\":\"im\", \"type\":\"double\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_180.m_begin = "&DataFileTest::testWriteDouble";
  local_180.m_end = "";
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_190.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_300.px = t1.px;
  local_300.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testWriteDouble,0,&local_180,&local_190,0x1e5,
                      &local_300);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_300.pn);
  local_1a0.m_begin = "&DataFileTest::testReadDouble";
  local_1a0.m_end = "";
  local_1b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_1b0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_310.px = t1.px;
  local_310.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testReadDouble,0,&local_1a0,&local_1b0,0x1e6,
                      &local_310);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_310.pn);
  local_1c0.m_begin = "&DataFileTest::testReadDoubleTwoStep";
  local_1c0.m_end = "";
  local_1d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_1d0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_320.px = t1.px;
  local_320.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testReadDoubleTwoStep,0,&local_1c0,&local_1d0,0x1e8
                      ,&local_320);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_320.pn);
  local_1e0.m_begin = "&DataFileTest::testReadDoubleTwoStepProject";
  local_1e0.m_end = "";
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_1f0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_330.px = t1.px;
  local_330.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testReadDoubleTwoStepProject,0,&local_1e0,
                      &local_1f0,0x1ea,&local_330);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_330.pn);
  local_200.m_begin = "&DataFileTest::testCleanup";
  local_200.m_end = "";
  local_210.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_210.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_340.px = t1.px;
  local_340.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testCleanup,0,&local_200,&local_210,0x1eb,
                      &local_340);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_340.pn);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_a0.m_begin = "DataFile tests: test4.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test4.df");
  local_a0.m_end = "DataFile tests: test4.df" + sVar2;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_b0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_a0,&local_b0,0x1ef);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test4.df",
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"},{\"name\":\"im\", \"type\":\"double\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_220.m_begin = "&DataFileTest::testTruncate";
  local_220.m_end = "";
  local_230.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_230.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_350.px = t1.px;
  local_350.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testTruncate,0,&local_220,&local_230,0x1f1,
                      &local_350);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_350.pn);
  local_240.m_begin = "&DataFileTest::testCleanup";
  local_240.m_end = "";
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_250.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_360.px = t1.px;
  local_360.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testCleanup,0,&local_240,&local_250,0x1f2,
                      &local_360);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_360.pn);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_c0.m_begin = "DataFile tests: test5.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test5.df");
  local_c0.m_end = "DataFile tests: test5.df" + sVar2;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_d0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_c0,&local_d0,0x1f6);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test5.df",
             "{\"type\": \"record\",\"name\":\"ComplexInteger\", \"fields\": [{\"name\":\"re\", \"type\":\"long\"},{\"name\":\"im\", \"type\":\"long\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexInteger\", \"fields\": [{\"name\":\"re\", \"type\":\"long\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_260.m_begin = "&DataFileTest::testWriteGenericByName";
  local_260.m_end = "";
  local_270.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_270.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_370.px = t1.px;
  local_370.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testWriteGenericByName,0,&local_260,&local_270,
                      0x1f9,&local_370);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_370.pn);
  addReaderTests(ptVar1,&t1);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_e0.m_begin = "DataFile tests: test6.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test6.df");
  local_e0.m_end = "DataFile tests: test6.df" + sVar2;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_f0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_e0,&local_f0,0x1fe);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test6.df",
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"},{\"name\":\"im\", \"type\":\"double\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_280.m_begin = "&DataFileTest::testZip";
  local_280.m_end = "";
  local_290.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_290.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_380.px = t1.px;
  local_380.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testZip,0,&local_280,&local_290,0x200,&local_380);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_380.pn);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_100.m_begin = "DataFile tests: test8.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test8.df");
  local_100.m_end = "DataFile tests: test8.df" + sVar2;
  local_110.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_110.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_100,&local_110,0x204);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test8.df",
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"},{\"name\":\"im\", \"type\":\"double\"}]}"
             ,
             "{\"type\": \"record\",\"name\":\"ComplexDouble\", \"fields\": [{\"name\":\"re\", \"type\":\"double\"}]}"
            );
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  ptVar1 = (test_suite *)operator_new(0x180);
  local_120.m_begin = "DataFile tests: test7.df";
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("DataFile tests: test7.df");
  local_120.m_end = "DataFile tests: test7.df" + sVar2;
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_130.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  boost::unit_test::test_suite::test_suite(ptVar1,&local_120,&local_130,0x209);
  pDVar3 = (DataFileTest *)operator_new(0x28);
  DataFileTest::DataFileTest
            (pDVar3,"test7.df","{\"type\": \"fixed\",\"name\":\"Fixed_32\", \"size\":4}",
             "{\"type\": \"fixed\",\"name\":\"Fixed_32\", \"size\":4}");
  boost::shared_ptr<DataFileTest>::shared_ptr<DataFileTest>(&t1,pDVar3);
  local_2a0.m_begin = "&DataFileTest::testSchemaReadWrite";
  local_2a0.m_end = "";
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_2b0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_390.px = t1.px;
  local_390.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testSchemaReadWrite,0,&local_2a0,&local_2b0,0x20b,
                      &local_390);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_390.pn);
  local_2c0.m_begin = "&DataFileTest::testCleanup";
  local_2c0.m_end = "";
  local_2d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  sVar2 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
                    );
  local_2d0.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
       + sVar2;
  local_3a0.px = t1.px;
  local_3a0.pn.pi_ = t1.pn.pi_;
  if (t1.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (t1.pn.pi_)->use_count_ = (t1.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  ptVar4 = boost::unit_test::make_test_case<DataFileTest,DataFileTest>
                     ((unit_test *)DataFileTest::testCleanup,0,&local_2c0,&local_2d0,0x20c,
                      &local_3a0);
  boost::unit_test::test_suite::add(ptVar1,&ptVar4->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&local_3a0.pn);
  pmVar5 = boost::unit_test::framework::master_test_suite();
  boost::unit_test::test_suite::add(&pmVar5->super_test_suite,&ptVar1->super_test_unit,0,0);
  boost::detail::shared_count::~shared_count(&t1.pn);
  return (test_suite *)0x0;
}

Assistant:

test_suite*
init_unit_test_suite( int argc, char* argv[] )
{
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test1.df");
        shared_ptr<DataFileTest> t1(new DataFileTest("test1.df", sch, isch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testWrite, t1));
        addReaderTests(ts, t1);
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test2.df");
        shared_ptr<DataFileTest> t2(new DataFileTest("test2.df", sch, isch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testWriteGeneric, t2));
        addReaderTests(ts, t2);
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test3.df");
        shared_ptr<DataFileTest> t3(new DataFileTest("test3.df", dsch, dblsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testWriteDouble, t3));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testReadDouble, t3));
        ts->add(
            BOOST_CLASS_TEST_CASE(&DataFileTest::testReadDoubleTwoStep, t3));
        ts->add(BOOST_CLASS_TEST_CASE(
            &DataFileTest::testReadDoubleTwoStepProject, t3));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testCleanup, t3));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test4.df");
        shared_ptr<DataFileTest> t4(new DataFileTest("test4.df", dsch, dblsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testTruncate, t4));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testCleanup, t4));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test5.df");
        shared_ptr<DataFileTest> t5(new DataFileTest("test5.df", sch, isch));
        ts->add(
            BOOST_CLASS_TEST_CASE(&DataFileTest::testWriteGenericByName, t5));
        addReaderTests(ts, t5);
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test6.df");
        shared_ptr<DataFileTest> t6(new DataFileTest("test6.df", dsch, dblsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testZip, t6));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test8.df");
        shared_ptr<DataFileTest> t8(new DataFileTest("test8.df", dsch, dblsch));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    {
        test_suite *ts = BOOST_TEST_SUITE("DataFile tests: test7.df");
        shared_ptr<DataFileTest> t7(new DataFileTest("test7.df", fsch, fsch));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testSchemaReadWrite, t7));
        ts->add(BOOST_CLASS_TEST_CASE(&DataFileTest::testCleanup, t7));
        boost::unit_test::framework::master_test_suite().add(ts);
    }
    return 0;
}